

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

int use_new(void)

{
  undefined4 *puVar1;
  int nights;
  
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 0x3e9;
  std::operator<<((ostream *)&std::cout,"nights = ");
}

Assistant:

int use_new () {
    using namespace std;
    int nights= 1001;
    //  申请一个 int 类型的地址
    int * pt = new int;
    //  给这个地址处赋值1001
    *pt = 1001;

    cout << "nights = " << nights << endl;
    cout << nights << "location = " << & nights << endl;

    cout << "int value = " << *pt << "; location = " << pt << endl;

    double * pd = new double;
    *pd = 10011002.0;
    cout << "double value = " << *pd << "; location = " << pd << endl;

    cout << "size of pt = " << sizeof(pt) << endl;
    cout << "size of *pt = " << sizeof(*pt) << endl;

    cout << "size of pd = " << sizeof(pd) << endl;
    cout << "size of *pd = " << sizeof(*pd) << endl;

    // sizeof a address: 4 byte = 32bit

    delete pd;
    cout << "after delete, *pd = " << *pd << endl;

    // array with new

    double *p3 = new double[3];
    //  用起来和普通ARRAY没什么区别...
    p3[0] = 0.1;
    p3[1] = 0.2;
    p3[2] = 0.3;

    cout << "p3[1] is " << p3[1] << endl;
    p3 = p3 + 1;
    cout << "now p3[1] is " << p3[1] << endl;

    p3 = p3 - 1;
    delete [] p3;
    cout << "after delete, p3[1]" << p3[0] << endl;

    return 0;
}